

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O0

int nc_match_single(GENERAL_NAME *gen,GENERAL_NAME *base)

{
  GENERAL_NAME *base_local;
  GENERAL_NAME *gen_local;
  
  switch(base->type) {
  case 1:
    gen_local._4_4_ = nc_email((gen->d).rfc822Name,(base->d).rfc822Name);
    break;
  case 2:
    gen_local._4_4_ = nc_dns((gen->d).rfc822Name,(base->d).rfc822Name);
    break;
  default:
    gen_local._4_4_ = 0x33;
    break;
  case 4:
    gen_local._4_4_ = nc_dn((gen->d).directoryName,(base->d).directoryName);
    break;
  case 6:
    gen_local._4_4_ = nc_uri((gen->d).rfc822Name,(base->d).rfc822Name);
  }
  return gen_local._4_4_;
}

Assistant:

static int nc_match_single(GENERAL_NAME *gen, GENERAL_NAME *base) {
  switch (base->type) {
    case GEN_DIRNAME:
      return nc_dn(gen->d.directoryName, base->d.directoryName);

    case GEN_DNS:
      return nc_dns(gen->d.dNSName, base->d.dNSName);

    case GEN_EMAIL:
      return nc_email(gen->d.rfc822Name, base->d.rfc822Name);

    case GEN_URI:
      return nc_uri(gen->d.uniformResourceIdentifier,
                    base->d.uniformResourceIdentifier);

    default:
      return X509_V_ERR_UNSUPPORTED_CONSTRAINT_TYPE;
  }
}